

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  undefined4 uVar1;
  istream *this;
  ostream *poVar2;
  undefined4 uVar3;
  int iVar4;
  size_type *local_78;
  string enemy;
  string answer;
  int count;
  int dist;
  
  do {
    std::istream::operator>>((istream *)&std::cin,(int *)(answer.field_2._M_local_buf + 8));
    std::istream::ignore();
    enemy.field_2._8_8_ = &answer._M_string_length;
    answer._M_dataplus._M_p = (pointer)0x0;
    answer._M_string_length._0_1_ = 0;
    uVar3 = 0x18894;
    for (iVar4 = 0; iVar4 < (int)answer.field_2._8_4_; iVar4 = iVar4 + 1) {
      local_78 = &enemy._M_string_length;
      enemy._M_dataplus._M_p = (pointer)0x0;
      enemy._M_string_length._0_1_ = 0;
      this = std::operator>>((istream *)&std::cin,(string *)&local_78);
      std::istream::operator>>(this,(int *)(answer.field_2._M_local_buf + 0xc));
      std::istream::ignore();
      uVar1 = answer.field_2._12_4_;
      if ((int)answer.field_2._12_4_ < (int)uVar3) {
        std::__cxx11::string::_M_assign((string *)(enemy.field_2._M_local_buf + 8));
        uVar3 = uVar1;
      }
      std::__cxx11::string::~string((string *)&local_78);
    }
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)(enemy.field_2._M_local_buf + 8));
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)(enemy.field_2._M_local_buf + 8));
  } while( true );
}

Assistant:

int main()
{

    // game loop
    while (1) {
        int count; // The number of current enemy ships within range
        cin >> count; cin.ignore();
        std::string answer;
        int min = 100500;
        for (int i = 0; i < count; i++)
        {
            string enemy; // The name of this enemy
            int dist; // The distance to your cannon of this enemy
            cin >> enemy >> dist; cin.ignore();
            if (min > dist)
            {
                min = dist;
                answer = enemy;
            }
        }

        // Write an action using cout. DON'T FORGET THE "<< endl"
        // To debug: cerr << "Debug messages..." << endl;

        cout << answer << endl; // The name of the most threatening enemy (HotDroid is just one example)
    }
}